

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O1

bool tinyobj::ParseTextureNameAndOption(string *texname,texture_option_t *texopt,char *linebuf)

{
  int iVar1;
  size_t sVar2;
  undefined1 *extraout_RAX;
  undefined1 *puVar3;
  texture_type_t tVar4;
  byte bVar5;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  string texture_name;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  ulong local_88;
  undefined1 *local_80;
  undefined8 local_78;
  undefined1 local_70 [16];
  string *local_60;
  string *local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  local_60 = (string *)&texopt->colorspace;
  local_88 = 0;
  local_58 = texname;
  while ((0xd < (byte)*linebuf || ((0x2401U >> ((byte)*linebuf & 0x1f) & 1) == 0))) {
    sVar2 = strspn(linebuf," \t");
    pbVar6 = (byte *)linebuf + sVar2;
    iVar1 = strncmp((char *)pbVar6,"-blendu",7);
    if ((iVar1 == 0) && ((pbVar6[7] == 0x20 || (pbVar6[7] == 9)))) {
      sVar2 = strspn((char *)(pbVar6 + 8)," \t");
      pbVar6 = pbVar6 + sVar2 + 8;
      sVar2 = strcspn((char *)pbVar6," \t\r");
      iVar1 = strncmp((char *)pbVar6,"on",2);
      if (iVar1 == 0) {
        bVar8 = true;
      }
      else {
        iVar1 = strncmp((char *)pbVar6,"off",3);
        bVar8 = iVar1 != 0;
      }
      linebuf = (char *)(pbVar6 + sVar2);
      texopt->blendu = bVar8;
    }
    else {
      iVar1 = strncmp((char *)pbVar6,"-blendv",7);
      if ((iVar1 == 0) && ((pbVar6[7] == 0x20 || (pbVar6[7] == 9)))) {
        sVar2 = strspn((char *)(pbVar6 + 8)," \t");
        pbVar6 = pbVar6 + sVar2 + 8;
        sVar2 = strcspn((char *)pbVar6," \t\r");
        iVar1 = strncmp((char *)pbVar6,"on",2);
        if (iVar1 == 0) {
          bVar8 = true;
        }
        else {
          iVar1 = strncmp((char *)pbVar6,"off",3);
          bVar8 = iVar1 != 0;
        }
        linebuf = (char *)(pbVar6 + sVar2);
        texopt->blendv = bVar8;
      }
      else {
        iVar1 = strncmp((char *)pbVar6,"-clamp",6);
        if ((iVar1 == 0) && ((pbVar6[6] == 0x20 || (pbVar6[6] == 9)))) {
          sVar2 = strspn((char *)(pbVar6 + 7)," \t");
          pbVar6 = pbVar6 + sVar2 + 7;
          sVar2 = strcspn((char *)pbVar6," \t\r");
          iVar1 = strncmp((char *)pbVar6,"on",2);
          if (iVar1 == 0) {
            bVar8 = true;
          }
          else {
            iVar1 = strncmp((char *)pbVar6,"off",3);
            bVar8 = iVar1 != 0;
          }
          linebuf = (char *)(pbVar6 + sVar2);
          texopt->clamp = bVar8;
        }
        else {
          iVar1 = strncmp((char *)pbVar6,"-boost",6);
          if ((iVar1 == 0) && ((pbVar6[6] == 0x20 || (pbVar6[6] == 9)))) {
            sVar2 = strspn((char *)(pbVar6 + 7)," \t");
            pbVar6 = pbVar6 + sVar2 + 7;
            sVar2 = strcspn((char *)pbVar6," \t\r");
            linebuf = (char *)(pbVar6 + sVar2);
            local_a8[0] = (undefined1 *)0x3ff0000000000000;
            tryParseDouble((char *)pbVar6,linebuf,(double *)local_a8);
            texopt->sharpness = (float)(double)local_a8[0];
          }
          else {
            iVar1 = strncmp((char *)pbVar6,"-bm",3);
            if ((iVar1 == 0) && ((pbVar6[3] == 0x20 || (pbVar6[3] == 9)))) {
              sVar2 = strspn((char *)(pbVar6 + 4)," \t");
              pbVar6 = pbVar6 + sVar2 + 4;
              sVar2 = strcspn((char *)pbVar6," \t\r");
              linebuf = (char *)(pbVar6 + sVar2);
              local_a8[0] = (undefined1 *)0x3ff0000000000000;
              tryParseDouble((char *)pbVar6,linebuf,(double *)local_a8);
              texopt->bump_multiplier = (float)(double)local_a8[0];
            }
            else {
              iVar1 = strncmp((char *)pbVar6,"-o",2);
              if ((iVar1 == 0) && ((pbVar6[2] == 0x20 || (pbVar6[2] == 9)))) {
                sVar2 = strspn((char *)(pbVar6 + 3)," \t");
                pbVar6 = pbVar6 + sVar2 + 3;
                sVar2 = strcspn((char *)pbVar6," \t\r");
                pbVar7 = pbVar6 + sVar2;
                local_a8[0] = (undefined1 *)0x0;
                tryParseDouble((char *)pbVar6,(char *)pbVar7,(double *)local_a8);
                texopt->origin_offset[0] = (float)(double)local_a8[0];
                sVar2 = strspn((char *)pbVar7," \t");
                pbVar7 = pbVar7 + sVar2;
                sVar2 = strcspn((char *)pbVar7," \t\r");
                pbVar6 = pbVar7 + sVar2;
                local_a8[0] = (undefined1 *)0x0;
                tryParseDouble((char *)pbVar7,(char *)pbVar6,(double *)local_a8);
                texopt->origin_offset[1] = (float)(double)local_a8[0];
                sVar2 = strspn((char *)pbVar6," \t");
                pbVar6 = pbVar6 + sVar2;
                sVar2 = strcspn((char *)pbVar6," \t\r");
                linebuf = (char *)(pbVar6 + sVar2);
                local_a8[0] = (undefined1 *)0x0;
                tryParseDouble((char *)pbVar6,linebuf,(double *)local_a8);
                texopt->origin_offset[2] = (float)(double)local_a8[0];
              }
              else {
                iVar1 = strncmp((char *)pbVar6,"-s",2);
                if ((iVar1 == 0) && ((pbVar6[2] == 0x20 || (pbVar6[2] == 9)))) {
                  sVar2 = strspn((char *)(pbVar6 + 3)," \t");
                  pbVar6 = pbVar6 + sVar2 + 3;
                  sVar2 = strcspn((char *)pbVar6," \t\r");
                  pbVar7 = pbVar6 + sVar2;
                  local_a8[0] = (undefined1 *)0x3ff0000000000000;
                  tryParseDouble((char *)pbVar6,(char *)pbVar7,(double *)local_a8);
                  texopt->scale[0] = (float)(double)local_a8[0];
                  sVar2 = strspn((char *)pbVar7," \t");
                  pbVar7 = pbVar7 + sVar2;
                  sVar2 = strcspn((char *)pbVar7," \t\r");
                  pbVar6 = pbVar7 + sVar2;
                  local_a8[0] = (undefined1 *)0x3ff0000000000000;
                  tryParseDouble((char *)pbVar7,(char *)pbVar6,(double *)local_a8);
                  texopt->scale[1] = (float)(double)local_a8[0];
                  sVar2 = strspn((char *)pbVar6," \t");
                  pbVar6 = pbVar6 + sVar2;
                  sVar2 = strcspn((char *)pbVar6," \t\r");
                  linebuf = (char *)(pbVar6 + sVar2);
                  local_a8[0] = (undefined1 *)0x3ff0000000000000;
                  tryParseDouble((char *)pbVar6,linebuf,(double *)local_a8);
                  texopt->scale[2] = (float)(double)local_a8[0];
                }
                else {
                  iVar1 = strncmp((char *)pbVar6,"-t",2);
                  if ((iVar1 == 0) && ((pbVar6[2] == 0x20 || (pbVar6[2] == 9)))) {
                    sVar2 = strspn((char *)(pbVar6 + 3)," \t");
                    pbVar6 = pbVar6 + sVar2 + 3;
                    sVar2 = strcspn((char *)pbVar6," \t\r");
                    pbVar7 = pbVar6 + sVar2;
                    local_a8[0] = (undefined1 *)0x0;
                    tryParseDouble((char *)pbVar6,(char *)pbVar7,(double *)local_a8);
                    texopt->turbulence[0] = (float)(double)local_a8[0];
                    sVar2 = strspn((char *)pbVar7," \t");
                    pbVar7 = pbVar7 + sVar2;
                    sVar2 = strcspn((char *)pbVar7," \t\r");
                    pbVar6 = pbVar7 + sVar2;
                    local_a8[0] = (undefined1 *)0x0;
                    tryParseDouble((char *)pbVar7,(char *)pbVar6,(double *)local_a8);
                    texopt->turbulence[1] = (float)(double)local_a8[0];
                    sVar2 = strspn((char *)pbVar6," \t");
                    pbVar6 = pbVar6 + sVar2;
                    sVar2 = strcspn((char *)pbVar6," \t\r");
                    linebuf = (char *)(pbVar6 + sVar2);
                    local_a8[0] = (undefined1 *)0x0;
                    tryParseDouble((char *)pbVar6,linebuf,(double *)local_a8);
                    texopt->turbulence[2] = (float)(double)local_a8[0];
                  }
                  else {
                    iVar1 = strncmp((char *)pbVar6,"-type",5);
                    if ((iVar1 == 0) && ((pbVar6[5] == 0x20 || (pbVar6[5] == 9)))) {
                      sVar2 = strspn((char *)(pbVar6 + 5)," \t");
                      pbVar6 = pbVar6 + 5 + sVar2;
                      sVar2 = strcspn((char *)pbVar6," \t\r");
                      iVar1 = strncmp((char *)pbVar6,"cube_top",8);
                      if (iVar1 == 0) {
                        tVar4 = TEXTURE_TYPE_CUBE_TOP;
                      }
                      else {
                        iVar1 = strncmp((char *)pbVar6,"cube_bottom",0xb);
                        if (iVar1 == 0) {
                          tVar4 = TEXTURE_TYPE_CUBE_BOTTOM;
                        }
                        else {
                          iVar1 = strncmp((char *)pbVar6,"cube_left",9);
                          if (iVar1 == 0) {
                            tVar4 = TEXTURE_TYPE_CUBE_LEFT;
                          }
                          else {
                            iVar1 = strncmp((char *)pbVar6,"cube_right",10);
                            if (iVar1 == 0) {
                              tVar4 = TEXTURE_TYPE_CUBE_RIGHT;
                            }
                            else {
                              iVar1 = strncmp((char *)pbVar6,"cube_front",10);
                              if (iVar1 == 0) {
                                tVar4 = TEXTURE_TYPE_CUBE_FRONT;
                              }
                              else {
                                iVar1 = strncmp((char *)pbVar6,"cube_back",9);
                                if (iVar1 == 0) {
                                  tVar4 = TEXTURE_TYPE_CUBE_BACK;
                                }
                                else {
                                  iVar1 = strncmp((char *)pbVar6,"sphere",6);
                                  tVar4 = (texture_type_t)(iVar1 == 0);
                                }
                              }
                            }
                          }
                        }
                      }
                      linebuf = (char *)(pbVar6 + sVar2);
                      texopt->type = tVar4;
                    }
                    else {
                      iVar1 = strncmp((char *)pbVar6,"-texres",7);
                      if ((iVar1 == 0) && ((pbVar6[7] == 0x20 || (pbVar6[7] == 9)))) {
                        sVar2 = strspn((char *)(pbVar6 + 7)," \t");
                        pbVar6 = pbVar6 + 7 + sVar2;
                        iVar1 = atoi((char *)pbVar6);
                        sVar2 = strcspn((char *)pbVar6," \t\r");
                        linebuf = (char *)(pbVar6 + sVar2);
                        texopt->texture_resolution = iVar1;
                      }
                      else {
                        iVar1 = strncmp((char *)pbVar6,"-imfchan",8);
                        if ((iVar1 == 0) && ((pbVar6[8] == 0x20 || (pbVar6[8] == 9)))) {
                          sVar2 = strspn((char *)(pbVar6 + 9)," \t");
                          pbVar6 = pbVar6 + sVar2 + 9;
                          sVar2 = strcspn((char *)pbVar6," \t\r");
                          linebuf = (char *)(pbVar6 + sVar2);
                          if (sVar2 == 1) {
                            texopt->imfchan = *pbVar6;
                          }
                        }
                        else {
                          iVar1 = strncmp((char *)pbVar6,"-mm",3);
                          if ((iVar1 == 0) && ((pbVar6[3] == 0x20 || (pbVar6[3] == 9)))) {
                            sVar2 = strspn((char *)(pbVar6 + 4)," \t");
                            pbVar6 = pbVar6 + sVar2 + 4;
                            sVar2 = strcspn((char *)pbVar6," \t\r");
                            pbVar7 = pbVar6 + sVar2;
                            local_a8[0] = (undefined1 *)0x0;
                            tryParseDouble((char *)pbVar6,(char *)pbVar7,(double *)local_a8);
                            texopt->brightness = (float)(double)local_a8[0];
                            sVar2 = strspn((char *)pbVar7," \t");
                            pbVar7 = pbVar7 + sVar2;
                            sVar2 = strcspn((char *)pbVar7," \t\r");
                            linebuf = (char *)(pbVar7 + sVar2);
                            local_a8[0] = (undefined1 *)0x3ff0000000000000;
                            tryParseDouble((char *)pbVar7,linebuf,(double *)local_a8);
                            texopt->contrast = (float)(double)local_a8[0];
                          }
                          else {
                            iVar1 = strncmp((char *)pbVar6,"-colorspace",0xb);
                            if ((iVar1 == 0) && ((pbVar6[0xb] == 0x20 || (pbVar6[0xb] == 9)))) {
                              local_80 = local_70;
                              local_78 = 0;
                              local_70[0] = 0;
                              sVar2 = strspn((char *)(pbVar6 + 0xc)," \t");
                              pbVar6 = pbVar6 + sVar2 + 0xc;
                              sVar2 = strcspn((char *)pbVar6," \t\r");
                              linebuf = (char *)(pbVar6 + sVar2);
                              local_a8[0] = local_98;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_a8,pbVar6,linebuf);
                              std::__cxx11::string::operator=
                                        ((string *)&local_80,(string *)local_a8);
                              if (local_a8[0] != local_98) {
                                operator_delete(local_a8[0]);
                              }
                              std::__cxx11::string::operator=(local_60,(string *)&local_80);
                              if (local_80 != local_70) {
                                operator_delete(local_80);
                              }
                            }
                            else {
                              std::__cxx11::string::string
                                        ((string *)local_a8,(char *)pbVar6,(allocator *)&local_80);
                              std::__cxx11::string::operator=
                                        ((string *)&local_50,(string *)local_a8);
                              puVar3 = local_98;
                              if (local_a8[0] != puVar3) {
                                operator_delete(local_a8[0]);
                                puVar3 = extraout_RAX;
                              }
                              linebuf = (char *)(pbVar6 + local_48);
                              local_88 = CONCAT71((int7)((ulong)puVar3 >> 8),1);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  bVar5 = (byte)local_88;
  if ((local_88 & 1) != 0) {
    std::__cxx11::string::_M_assign((string *)local_58);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return (bool)(bVar5 & 1);
}

Assistant:

bool ParseTextureNameAndOption(std::string *texname, texture_option_t *texopt,
                               const char *linebuf) {
  // @todo { write more robust lexer and parser. }
  bool found_texname = false;
  std::string texture_name;

  const char *token = linebuf;  // Assume line ends with NULL

  while (!IS_NEW_LINE((*token))) {
    token += strspn(token, " \t");  // skip space
    if ((0 == strncmp(token, "-blendu", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendu = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-blendv", 7)) && IS_SPACE((token[7]))) {
      token += 8;
      texopt->blendv = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-clamp", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->clamp = parseOnOff(&token, /* default */ true);
    } else if ((0 == strncmp(token, "-boost", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      texopt->sharpness = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-bm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      texopt->bump_multiplier = parseReal(&token, 1.0);
    } else if ((0 == strncmp(token, "-o", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->origin_offset[0]), &(texopt->origin_offset[1]),
                 &(texopt->origin_offset[2]), &token);
    } else if ((0 == strncmp(token, "-s", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->scale[0]), &(texopt->scale[1]), &(texopt->scale[2]),
                 &token, 1.0, 1.0, 1.0);
    } else if ((0 == strncmp(token, "-t", 2)) && IS_SPACE((token[2]))) {
      token += 3;
      parseReal3(&(texopt->turbulence[0]), &(texopt->turbulence[1]),
                 &(texopt->turbulence[2]), &token);
    } else if ((0 == strncmp(token, "-type", 5)) && IS_SPACE((token[5]))) {
      token += 5;
      texopt->type = parseTextureType((&token), TEXTURE_TYPE_NONE);
    } else if ((0 == strncmp(token, "-texres", 7)) && IS_SPACE((token[7]))) {
      token += 7;
      // TODO(syoyo): Check if arg is int type.
      texopt->texture_resolution = parseInt(&token);
    } else if ((0 == strncmp(token, "-imfchan", 8)) && IS_SPACE((token[8]))) {
      token += 9;
      token += strspn(token, " \t");
      const char *end = token + strcspn(token, " \t\r");
      if ((end - token) == 1) {  // Assume one char for -imfchan
        texopt->imfchan = (*token);
      }
      token = end;
    } else if ((0 == strncmp(token, "-mm", 3)) && IS_SPACE((token[3]))) {
      token += 4;
      parseReal2(&(texopt->brightness), &(texopt->contrast), &token, 0.0, 1.0);
    } else if ((0 == strncmp(token, "-colorspace", 11)) &&
               IS_SPACE((token[11]))) {
      token += 12;
      texopt->colorspace = parseString(&token);
    } else {
// Assume texture filename
#if 0
      size_t len = strcspn(token, " \t\r");  // untile next space
      texture_name = std::string(token, token + len);
      token += len;

      token += strspn(token, " \t");  // skip space
#else
      // Read filename until line end to parse filename containing whitespace
      // TODO(syoyo): Support parsing texture option flag after the filename.
      texture_name = std::string(token);
      token += texture_name.length();
#endif

      found_texname = true;
    }
  }

  if (found_texname) {
    (*texname) = texture_name;
    return true;
  } else {
    return false;
  }
}